

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O1

int CVmObjByteArray::read_from_data_file(vm_val_t *retval,CVmDataSource *fp)

{
  int iVar1;
  uint uVar2;
  vm_obj_id_t self;
  unsigned_long uVar3;
  ulong ele_count;
  char buf [16];
  uint local_28 [4];
  
  iVar1 = (*fp->_vptr_CVmDataSource[2])(fp,local_28,4);
  uVar2 = 1;
  if (iVar1 == 0) {
    ele_count = (ulong)local_28[0];
    self = create(0,ele_count);
    retval->typ = VM_OBJ;
    (retval->val).obj = self;
    uVar3 = read_from_file((CVmObjByteArray *)
                           ((long)&G_obj_table_X.pages_[self >> 0xc]->ptr_ +
                           (ulong)((self & 0xfff) * 0x18)),self,fp,1,ele_count,0);
    uVar2 = (uint)(uVar3 != ele_count);
  }
  return uVar2;
}

Assistant:

int CVmObjByteArray::read_from_data_file(VMG_ vm_val_t *retval,
                                         CVmDataSource *fp)
{
    char buf[16];
    CVmObjByteArray *arr;
    unsigned long len;

    /* read the number of bytes in the array */
    if (fp->read(buf, 4))
        return 1;
    len = t3rp4u(buf);

    /* create a new ByteArray to hold the result */
    retval->set_obj(create(vmg_ FALSE, len));
    arr = (CVmObjByteArray *)vm_objp(vmg_ retval->val.obj);

    /* read the bytes (it's a new object, so don't save undo) */
    if (arr->read_from_file(vmg_ retval->val.obj, fp, 1, len, FALSE) != len)
    {
        /* 
         *   we didn't manage to read all of the bytes - since the value was
         *   tagged with the correct number of bytes, end-of-file in the
         *   middle of the bytes indicates a corrupted file, so return
         *   failure 
         */
        return 1;
    }

    /* success */
    return 0;
}